

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

int luaH_next(lua_State *L,Table *t,StkId key)

{
  uint uVar1;
  Node *n;
  TValue *pTVar2;
  long lVar3;
  Node *pNVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  TValue *io;
  uint uVar8;
  
  uVar1 = luaH_realasize(t);
  uVar7 = 0;
  if (((key->val).tt_ & 0xf) != 0) {
    if (((key->val).tt_ == 3) &&
       (uVar7 = *(ulong *)key & 0xffffffff, *(ulong *)key - 1 >> 0x1f != 0)) {
      uVar7 = 0;
    }
    if (uVar1 <= (int)uVar7 - 1U) {
      pTVar2 = getgeneric(t,&key->val,1);
      if (pTVar2->tt_ == ' ') {
        luaG_runerror(L,"invalid key to \'next\'");
      }
      uVar7 = (ulong)(uVar1 + (int)((ulong)((long)pTVar2 - (long)t->node) >> 3) * -0x55555555 + 1);
    }
  }
  uVar6 = (uint)uVar7;
  iVar5 = uVar1 - uVar6;
  if (uVar6 <= uVar1 && iVar5 != 0) {
    lVar3 = uVar7 << 4;
    do {
      uVar7 = uVar7 + 1;
      if (((&t->array->tt_)[lVar3] & 0xf) != 0) {
        (key->val).value_.i = uVar7 & 0xffffffff;
        (key->val).tt_ = '\x03';
        pNVar4 = (Node *)((long)&t->array->value_ + lVar3);
        goto LAB_001329e1;
      }
      lVar3 = lVar3 + 0x10;
      iVar5 = iVar5 + -1;
      uVar6 = uVar1;
    } while (iVar5 != 0);
  }
  uVar8 = 1 << (t->lsizenode & 0x1f);
  uVar6 = uVar6 - uVar1;
  if ((int)uVar6 < (int)uVar8) {
    do {
      if ((*(byte *)((long)t->node + (ulong)uVar6 * 0x18 + 8) & 0xf) != 0) {
        pNVar4 = t->node + uVar6;
        (key->val).value_ = (pNVar4->u).key_val;
        (key->val).tt_ = (pNVar4->u).key_tt;
LAB_001329e1:
        key[1].val.value_ = (pNVar4->u).value_;
        *(lu_byte *)((long)key + 0x18) = (pNVar4->u).tt_;
        return 1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  return 0;
}

Assistant:

int luaH_next (lua_State *L, Table *t, StkId key) {
  unsigned int asize = luaH_realasize(t);
  unsigned int i = findindex(L, t, s2v(key), asize);  /* find original key */
  for (; i < asize; i++) {  /* try first array part */
    if (!isempty(&t->array[i])) {  /* a non-empty entry? */
      setivalue(s2v(key), i + 1);
      setobj2s(L, key + 1, &t->array[i]);
      return 1;
    }
  }
  for (i -= asize; cast_int(i) < sizenode(t); i++) {  /* hash part */
    if (!isempty(gval(gnode(t, i)))) {  /* a non-empty entry? */
      Node *n = gnode(t, i);
      getnodekey(L, s2v(key), n);
      setobj2s(L, key + 1, gval(n));
      return 1;
    }
  }
  return 0;  /* no more elements */
}